

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

Batch * __thiscall jaegertracing::thrift::Batch::operator=(Batch *this,Batch *other49)

{
  Batch *other49_local;
  Batch *this_local;
  
  Process::operator=(&this->process,&other49->process);
  std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::operator=
            (&this->spans,&other49->spans);
  return this;
}

Assistant:

Batch& Batch::operator=(const Batch& other49) {
  process = other49.process;
  spans = other49.spans;
  return *this;
}